

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

int __thiscall slang::parsing::Token::init(Token *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  size_t sVar4;
  Info *pIVar5;
  const_pointer pvVar6;
  pointer pTVar7;
  byte *pbVar8;
  byte *pbVar9;
  undefined8 uVar10;
  TokenKind in_DX;
  SourceLocation in_R9;
  byte *dest;
  Trivia *triviaPtr;
  size_t size;
  size_t extra;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_10;
  undefined7 extraout_var;
  
  this->kind = in_DX;
  this->field_0x2 = this->field_0x2 & 0xfe;
  this->field_0x2 = this->field_0x2 & 0xe1;
  this->field_0x2 = this->field_0x2 & 0x1f;
  (this->numFlags).raw = '\0';
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
  this->rawLen = (uint32_t)sVar3;
  sVar4 = getExtraSize(this->kind);
  bVar1 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                    ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x39207a);
  if (!bVar1) {
    sVar3 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::size
                      ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x392096);
    if (sVar3 < 0xf) {
      sVar3 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::size
                        ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x3920c7);
      this->field_0x2 = this->field_0x2 & 0xe1 | ((byte)sVar3 & 0xf) << 1;
    }
    else {
      this->field_0x2 = this->field_0x2 & 0xe1 | 0x1e;
    }
  }
  pIVar5 = (Info *)BumpAllocator::allocate
                             (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(size_t)this);
  this->info = pIVar5;
  this->info->location = in_R9;
  pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008);
  this->info->rawTextPtr = pvVar6;
  bVar1 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::empty
                    ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x392133);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    pTVar7 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::data(&local_10);
    pbVar8 = Info::extra(this->info);
    pbVar8 = pbVar8 + sVar4;
    *(pointer *)pbVar8 = pTVar7;
    pbVar9 = (byte *)std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::size
                               ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
                                0x392178);
    if ((byte *)0xe < pbVar9) {
      pbVar9 = pbVar8;
      uVar10 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::size
                         ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x392188);
      *(undefined8 *)(pbVar9 + 8) = uVar10;
    }
    iVar2 = (int)pbVar9;
  }
  return iVar2;
}

Assistant:

void Token::init(BumpAllocator& alloc, TokenKind kind_, std::span<Trivia const> trivia,
                 std::string_view rawText, SourceLocation location) {
    kind = kind_;
    missing = false;
    triviaCountSmall = 0;
    reserved = 0;
    numFlags.raw = 0;
    rawLen = uint32_t(rawText.size());

    size_t extra = getExtraSize(kind);
    SLANG_ASSERT(extra % alignof(void*) == 0);

    size_t size = sizeof(Info) + extra;
    if (!trivia.empty()) {
        size += sizeof(Trivia*);
        if (trivia.size() > MaxTriviaSmallCount) {
            size += sizeof(size_t);
            triviaCountSmall = MaxTriviaSmallCount + 1;
        }
        else {
            triviaCountSmall = uint8_t(trivia.size());
        }
    }

    info = (Info*)alloc.allocate(size, alignof(Info));
    info->location = location;
    info->rawTextPtr = rawText.data();

    if (!trivia.empty()) {
        const Trivia* triviaPtr = trivia.data();
        byte* dest = info->extra() + extra;
        memcpy(dest, reinterpret_cast<const void*>(&triviaPtr), sizeof(triviaPtr));

        if (trivia.size() > MaxTriviaSmallCount) {
            size = trivia.size();
            memcpy(dest + sizeof(triviaPtr), &size, sizeof(size_t));
        }
    }
}